

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cvars.cpp
# Opt level: O0

void __thiscall
FBaseCVar::ForceSet(FBaseCVar *this,UCVarValue value,ECVarType type,bool nouserinfosend)

{
  bool nouserinfosend_local;
  ECVarType type_local;
  FBaseCVar *this_local;
  UCVarValue value_local;
  
  (*this->_vptr_FBaseCVar[9])(this,value.String,(ulong)type);
  if ((((this->Flags & 2) != 0) && (!nouserinfosend)) && ((this->Flags & 0x4000) == 0)) {
    D_UserInfoChanged(this);
  }
  if ((m_UseCallback & 1U) != 0) {
    Callback(this);
  }
  this->Flags = this->Flags & 0xffffff7f;
  return;
}

Assistant:

void FBaseCVar::ForceSet (UCVarValue value, ECVarType type, bool nouserinfosend)
{
	DoSet (value, type);
	if ((Flags & CVAR_USERINFO) && !nouserinfosend && !(Flags & CVAR_IGNORE))
		D_UserInfoChanged (this);
	if (m_UseCallback)
		Callback ();

	Flags &= ~CVAR_ISDEFAULT;
}